

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O1

void __thiscall dynamicgraph::SignalBase<int>::checkCompatibility(SignalBase<int> *this)

{
  ExceptionSignal *this_00;
  ErrorCodeEnum local_44;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_44 = PLUG_IMPOSSIBLE;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Abstract signal not compatible with anything.","");
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_44,(string *)local_40,"(while trying to plug <%s>).",
             (this->name)._M_dataplus._M_p);
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

virtual void checkCompatibility() {
    DG_THROW ExceptionSignal(ExceptionSignal::PLUG_IMPOSSIBLE,
                             "Abstract signal not compatible with anything.",
                             "(while trying to plug <%s>).",
                             this->getName().c_str());
  }